

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputInput(Node *this,ostream *os,int InputFlag)

{
  Node *pNVar1;
  ostream *poVar2;
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [48];
  undefined1 local_40 [44];
  int InputFlag_local;
  ostream *os_local;
  Node *this_local;
  
  IOChPrinted = 0;
  IOChannel = (Node *)0x0;
  IOUsing = (Node *)0x0;
  local_40._36_4_ = InputFlag;
  unique0x100002a3 = (Node *)os;
  os_local = (ostream *)this;
  if (this->Tree[0] != (Node *)0x0) {
    OutputInputData(this->Tree[0],os,InputFlag);
  }
  if (IOChPrinted != 0) {
    poVar2 = std::operator<<((ostream *)stack0xffffffffffffffe8,";");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  pNVar1 = stack0xffffffffffffffe8;
  if ((local_40._36_4_ & 1) != 0) {
    Indent_abi_cxx11_((Node *)local_40);
    poVar2 = std::operator<<((ostream *)pNVar1,(string *)local_40);
    poVar2 = std::operator<<(poVar2,"if (");
    GetIPChannel_abi_cxx11_((Node *)local_70,(int)IOChannel);
    poVar2 = std::operator<<(poVar2,(string *)local_70);
    poVar2 = std::operator<<(poVar2,".fail()) { ");
    GetIPChannel_abi_cxx11_((Node *)local_90,(int)IOChannel);
    poVar2 = std::operator<<(poVar2,(string *)local_90);
    poVar2 = std::operator<<(poVar2,".clear();");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)local_40);
    pNVar1 = stack0xffffffffffffffe8;
    Indent_abi_cxx11_((Node *)local_b0);
    poVar2 = std::operator<<((ostream *)pNVar1,(string *)local_b0);
    GetIPChannel_abi_cxx11_((Node *)local_d0,(int)IOChannel);
    poVar2 = std::operator<<(poVar2,(string *)local_d0);
    poVar2 = std::operator<<(poVar2,
                             ".ignore(std::numeric_limits<std::streamsize>::max(), \'\\n\'); }");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  return;
}

Assistant:

void Node::OutputInput(
	std::ostream& os,	/**< iostream to write C++ code to */
	int InputFlag		/**< INPUT/PRINT flag */
)
{
	//
	// Initialize flags
	//
	IOChPrinted = 0;		// Channel not yet printed
	IOChannel = 0;		// No channel specified
	IOUsing = 0;			// No print using specified

	//
	// Write out input statements
	//
	if (Tree[0] != 0)
	{
		Tree[0]->OutputInputData(os, InputFlag);
	}

	//
	// Finish off input statement
	//
	if (IOChPrinted != 0)
	{
		os << ";" << std::endl;
	}
	
	//
	// Try to handle bad entries with more grace.
	// Eat the bad entry instead of letting it block the next input.
	//
	if (InputFlag & 1)
	{
		os << Indent() <<
			"if (" << GetIPChannel(IOChannel, InputFlag) <<
			".fail()) { " << 
			GetIPChannel(IOChannel, InputFlag) << ".clear();" <<
			std::endl;
		os << Indent() <<
			GetIPChannel(IOChannel, InputFlag) << 
			".ignore(std::numeric_limits<std::streamsize>::max(), '\\n'); }" <<
			std::endl;
	}
}